

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::VariableStatement<tcu::Matrix<float,_4,_3>_>::doPrint
          (VariableStatement<tcu::Matrix<float,_4,_3>_> *this,ostream *os)

{
  Variable<tcu::Matrix<float,_4,_3>_> *pVVar1;
  pointer pcVar2;
  Expr<tcu::Matrix<float,_4,_3>_> *pEVar3;
  string local_98;
  DeclareVariable local_78;
  VarType local_38;
  
  if (this->m_isDeclaration == true) {
    glu::VarType::VarType(&local_38,TYPE_FLOAT_MAT3X4,PRECISION_LAST);
    pVVar1 = (this->m_variable).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.m_ptr;
    pcVar2 = (pVVar1->m_name)._M_dataplus._M_p;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar2,pcVar2 + (pVVar1->m_name)._M_string_length);
    glu::decl::DeclareVariable::DeclareVariable(&local_78,&local_38,&local_98,0);
    glu::decl::operator<<(os,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
      operator_delete(local_78.name._M_dataplus._M_p,local_78.name.field_2._M_allocated_capacity + 1
                     );
    }
    glu::VarType::~VarType(&local_78.varType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    glu::VarType::~VarType(&local_38);
  }
  else {
    pVVar1 = (this->m_variable).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.m_ptr;
    pcVar2 = (pVVar1->m_name)._M_dataplus._M_p;
    local_78.varType._0_8_ = (long)&local_78 + 0x10U;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar2,pcVar2 + (pVVar1->m_name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(char *)local_78.varType._0_8_,(long)local_78.varType.m_data.basic);
    if (local_78.varType._0_8_ != (long)&local_78 + 0x10U) {
      operator_delete((void *)local_78.varType._0_8_,local_78.varType.m_data._8_8_ + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
  pEVar3 = (this->m_value).super_ContainerExprPBase<tcu::Matrix<float,_4,_3>_>.
           super_ExprPBase<tcu::Matrix<float,_4,_3>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_4,_3>_>_>.m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[2])(pEVar3,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,";\n",2);
  return;
}

Assistant:

void			doPrint				(ostream& os)							const
	{
		if (m_isDeclaration)
			os << glu::declare(getVarTypeOf<T>(), m_variable->getName());
		else
			os << m_variable->getName();

		os << " = " << *m_value << ";\n";
	}